

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

opj_sparse_array_int32_t * opj_dwt_init_sparse_array(opj_tcd_tilecomp_t *tilec,OPJ_UINT32 numres)

{
  opj_tcd_precinct_t *poVar1;
  opj_tcd_cblk_enc_t *poVar2;
  OPJ_UINT32 OVar3;
  OPJ_UINT32 a;
  OPJ_UINT32 block_width;
  OPJ_UINT32 block_height;
  OPJ_BOOL OVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_band_t *poVar6;
  opj_tcd_resolution_t *pres_1;
  opj_tcd_resolution_t *pres;
  OPJ_UINT32 cblk_h;
  OPJ_UINT32 cblk_w;
  OPJ_UINT32 y;
  OPJ_UINT32 x;
  opj_tcd_cblk_dec_t *cblk;
  opj_tcd_precinct_t *precinct;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  opj_sparse_array_int32_t *sa;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  OPJ_UINT32 h;
  OPJ_UINT32 w;
  opj_tcd_resolution_t *tr_max;
  OPJ_UINT32 numres_local;
  opj_tcd_tilecomp_t *tilec_local;
  
  poVar5 = tilec->resolutions + (numres - 1);
  OVar3 = poVar5->x1 - poVar5->x0;
  a = poVar5->y1 - poVar5->y0;
  block_width = opj_uint_min(OVar3,0x40);
  block_height = opj_uint_min(a,0x40);
  tilec_local = (opj_tcd_tilecomp_t *)
                opj_sparse_array_int32_create(OVar3,a,block_width,block_height);
  if (tilec_local == (opj_tcd_tilecomp_t *)0x0) {
    tilec_local = (opj_tcd_tilecomp_t *)0x0;
  }
  else {
    for (precno = 0; precno < numres; precno = precno + 1) {
      poVar5 = tilec->resolutions;
      for (cblkno = 0; cblkno < poVar5[precno].numbands; cblkno = cblkno + 1) {
        poVar6 = poVar5[precno].bands + cblkno;
        for (sa._4_4_ = 0; sa._4_4_ < poVar5[precno].pw * poVar5[precno].ph; sa._4_4_ = sa._4_4_ + 1
            ) {
          poVar1 = poVar6->precincts;
          for (sa._0_4_ = 0; (uint)sa < poVar1[sa._4_4_].cw * poVar1[sa._4_4_].ch;
              sa._0_4_ = (uint)sa + 1) {
            poVar2 = poVar1[sa._4_4_].cblks.enc;
            if (*(long *)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x40) != 0) {
              cblk_w = *(int *)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x10) - poVar6->x0;
              cblk_h = *(int *)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x14) - poVar6->y0;
              OVar3 = *(int *)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x18) -
                      *(int *)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x10);
              if ((poVar6->bandno & 1) != 0) {
                cblk_w = (tilec->resolutions[precno - 1].x1 - tilec->resolutions[precno - 1].x0) +
                         cblk_w;
              }
              if ((poVar6->bandno & 2) != 0) {
                cblk_h = (tilec->resolutions[precno - 1].y1 - tilec->resolutions[precno - 1].y0) +
                         cblk_h;
              }
              OVar4 = opj_sparse_array_int32_write
                                ((opj_sparse_array_int32_t *)tilec_local,cblk_w,cblk_h,
                                 cblk_w + OVar3,
                                 cblk_h + (*(int *)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x1c) -
                                          *(int *)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x14)),
                                 *(OPJ_INT32 **)((long)poVar2 + (ulong)(uint)sa * 0x48 + 0x40),1,
                                 OVar3,1);
              if (OVar4 == 0) {
                opj_sparse_array_int32_free((opj_sparse_array_int32_t *)tilec_local);
                return (opj_sparse_array_int32_t *)0x0;
              }
            }
          }
        }
      }
    }
  }
  return (opj_sparse_array_int32_t *)tilec_local;
}

Assistant:

static opj_sparse_array_int32_t* opj_dwt_init_sparse_array(
    opj_tcd_tilecomp_t* tilec,
    OPJ_UINT32 numres)
{
    opj_tcd_resolution_t* tr_max = &(tilec->resolutions[numres - 1]);
    OPJ_UINT32 w = (OPJ_UINT32)(tr_max->x1 - tr_max->x0);
    OPJ_UINT32 h = (OPJ_UINT32)(tr_max->y1 - tr_max->y0);
    OPJ_UINT32 resno, bandno, precno, cblkno;
    opj_sparse_array_int32_t* sa = opj_sparse_array_int32_create(
                                       w, h, opj_uint_min(w, 64), opj_uint_min(h, 64));
    if (sa == NULL) {
        return NULL;
    }

    for (resno = 0; resno < numres; ++resno) {
        opj_tcd_resolution_t* res = &tilec->resolutions[resno];

        for (bandno = 0; bandno < res->numbands; ++bandno) {
            opj_tcd_band_t* band = &res->bands[bandno];

            for (precno = 0; precno < res->pw * res->ph; ++precno) {
                opj_tcd_precinct_t* precinct = &band->precincts[precno];
                for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                    opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                    if (cblk->decoded_data != NULL) {
                        OPJ_UINT32 x = (OPJ_UINT32)(cblk->x0 - band->x0);
                        OPJ_UINT32 y = (OPJ_UINT32)(cblk->y0 - band->y0);
                        OPJ_UINT32 cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
                        OPJ_UINT32 cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);

                        if (band->bandno & 1) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            x += (OPJ_UINT32)(pres->x1 - pres->x0);
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t* pres = &tilec->resolutions[resno - 1];
                            y += (OPJ_UINT32)(pres->y1 - pres->y0);
                        }

                        if (!opj_sparse_array_int32_write(sa, x, y,
                                                          x + cblk_w, y + cblk_h,
                                                          cblk->decoded_data,
                                                          1, cblk_w, OPJ_TRUE)) {
                            opj_sparse_array_int32_free(sa);
                            return NULL;
                        }
                    }
                }
            }
        }
    }

    return sa;
}